

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-0.c
# Opt level: O1

int checkerBig(void)

{
  int iVar1;
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar2;
  int n;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
    pcVar2 = "can\'t open out.txt";
    goto LAB_0010262c;
  }
  pcVar2 = ScanInt((FILE *)__stream,&local_14);
  if (pcVar2 == "PASSED") {
    if (local_14 != 0x15) {
      printf("wrong output -- ");
      goto LAB_00102618;
    }
    iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
    fclose(__stream);
    if (iVar1 == 0) {
      iVar1 = 0;
      pcVar2 = "PASSED";
      goto LAB_0010262c;
    }
  }
  else {
LAB_00102618:
    fclose(__stream);
  }
  iVar1 = 1;
  pcVar2 = "FAILED";
LAB_0010262c:
  puts(pcVar2);
  testN = testN + 1;
  return iVar1;
}

Assistant:

static int checkerBig(void)
{
  FILE *const out = fopen("out.txt", "r");
  int passed = 1;
  if (!out) {
    printf("can't open out.txt\n");
    testN++;
    return -1;
  }
  {
    int n;
    if (ScanInt(out, &n) != Pass) {
      passed = 0;
    } else if (21 != n) {
      passed = 0;
      printf("wrong output -- ");
    }
  }
  if (passed) {
    passed = !HaveGarbageAtTheEnd(out);
  }
  fclose(out);
  if (passed) {
    printf("PASSED\n");
    testN++;
    return 0;
  } else {
    printf("FAILED\n");
    testN++;
    return 1;
  }
}